

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O3

int luaopen_table(lua_State *L)

{
  lj_lib_register(L,"table",lj_lib_init_table,lj_lib_cf_table);
  lj_lib_prereg(L,"table.new",luaopen_table_new,(GCtab *)(ulong)L->top[-1].u32.lo);
  lj_lib_prereg(L,"table.clear",luaopen_table_clear,(GCtab *)(ulong)L->top[-1].u32.lo);
  return 1;
}

Assistant:

LUALIB_API int luaopen_table(lua_State *L)
{
  LJ_LIB_REG(L, LUA_TABLIBNAME, table);
#if LJ_52
  lua_getglobal(L, "unpack");
  lua_setfield(L, -2, "unpack");
#endif
  lj_lib_prereg(L, LUA_TABLIBNAME ".new", luaopen_table_new, tabV(L->top-1));
  lj_lib_prereg(L, LUA_TABLIBNAME ".clear", luaopen_table_clear, tabV(L->top-1));
  return 1;
}